

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

void detect(yolo_image *img,ggml_cgraph *gf,yolo_model *model,float thresh,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *labels,vector<yolo_image,_std::allocator<yolo_image>_> *alphabet)

{
  initializer_list<int> __l;
  initializer_list<float> __l_00;
  initializer_list<int> __l_01;
  initializer_list<float> __l_02;
  int iVar1;
  vector<float,_std::allocator<float>_> *this;
  float *pfVar2;
  size_type sVar3;
  long in_RDX;
  undefined8 in_RSI;
  bool bVar4;
  yolo_layer yolo23;
  ggml_tensor *layer_22;
  yolo_layer yolo16;
  ggml_tensor *layer_15;
  ggml_tensor *input;
  yolo_image sized;
  vector<detection,_std::allocator<detection>_> detections;
  yolo_layer *this_00;
  yolo_layer *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  yolo_image *in_stack_fffffffffffffd78;
  vector<float,_std::allocator<float>_> *anchors;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd80;
  vector<detection,_std::allocator<detection>_> *dets;
  undefined8 in_stack_fffffffffffffd88;
  int iVar5;
  yolo_layer *in_stack_fffffffffffffd90;
  yolo_layer *this_01;
  undefined4 local_224;
  undefined4 uVar6;
  undefined4 uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels_00;
  float thresh_00;
  vector<detection,_std::allocator<detection>_> *in_stack_fffffffffffffdf8;
  yolo_image *in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  vector<detection,_std::allocator<detection>_> *in_stack_fffffffffffffe28;
  yolo_layer *in_stack_fffffffffffffe30;
  yolo_layer local_189;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 *local_118;
  undefined8 local_110;
  undefined8 local_98;
  uint local_8c;
  vector<float,_std::allocator<float>_> *local_88;
  long local_18;
  undefined8 local_10;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<detection,_std::allocator<detection>_>::vector
            ((vector<detection,_std::allocator<detection>_> *)0x107915);
  letterbox_image(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,in_stack_fffffffffffffd70);
  this = (vector<float,_std::allocator<float>_> *)ggml_graph_get_tensor(local_10,"input");
  local_88 = this;
  pfVar2 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x10797b);
  sVar3 = ggml_nbytes(local_88);
  ggml_backend_tensor_set(this,pfVar2,0,sVar3);
  iVar1 = ggml_backend_graph_compute(*(undefined8 *)(local_18 + 0x20),local_10);
  bVar4 = iVar1 == 0;
  if (bVar4) {
    local_98 = ggml_graph_get_tensor(local_10,"layer_15");
    local_124 = 3;
    local_120 = 4;
    local_11c = 5;
    local_118 = &local_124;
    local_110 = 3;
    std::allocator<int>::allocator((allocator<int> *)0x107aae);
    __l._M_len = sVar3;
    __l._M_array = (iterator)pfVar2;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this,__l,
               (allocator_type *)CONCAT44(iVar1,in_stack_fffffffffffffd48));
    local_189.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._1_8_ = 0x4329000043070000;
    local_189.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._9_8_ = 0x439f800043ac0000;
    local_189.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _9_8_ = 0x4268000042140000;
    local_189._25_8_ = 0x42a4000042a20000;
    local_189._1_8_ = 0x4160000041200000;
    local_189.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _1_8_ = 0x41d8000041b80000;
    local_189.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._1_8_ = (long)&local_189.classes + 1;
    local_189.predictions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._9_8_ = 0xc;
    in_stack_fffffffffffffd30 = &local_189;
    std::allocator<float>::allocator((allocator<float> *)0x107b2d);
    __l_00._M_len = sVar3;
    __l_00._M_array = pfVar2;
    std::vector<float,_std::allocator<float>_>::vector
              (this,__l_00,(allocator_type *)CONCAT44(iVar1,in_stack_fffffffffffffd48));
    yolo_layer::yolo_layer
              (in_stack_fffffffffffffd90,iVar5,in_stack_fffffffffffffd80,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd78,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd30);
    std::allocator<float>::~allocator((allocator<float> *)0x107b97);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
    std::allocator<int>::~allocator((allocator<int> *)0x107bb1);
    apply_yolo(in_stack_fffffffffffffd30);
    get_yolo_detections(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
                        in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe14);
    ggml_graph_get_tensor(local_10,"layer_22");
    local_224 = 0;
    uVar6 = 1;
    uVar7 = 2;
    labels_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_224;
    thresh_00 = 0.0;
    this_00 = (yolo_layer *)&stack0xfffffffffffffddb;
    std::allocator<int>::allocator((allocator<int> *)0x107c73);
    __l_01._M_len = sVar3;
    __l_01._M_array = (iterator)pfVar2;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this,__l_01,
               (allocator_type *)CONCAT44(iVar1,in_stack_fffffffffffffd48));
    iVar5 = 0x42680000;
    this_01 = (yolo_layer *)0x42a4000042a20000;
    anchors = (vector<float,_std::allocator<float>_> *)0x4160000041200000;
    dets = (vector<detection,_std::allocator<detection>_> *)0x41d8000041b80000;
    std::allocator<float>::allocator((allocator<float> *)0x107ce5);
    __l_02._M_len = sVar3;
    __l_02._M_array = pfVar2;
    std::vector<float,_std::allocator<float>_>::vector
              (this,__l_02,(allocator_type *)CONCAT44(iVar1,in_stack_fffffffffffffd48));
    yolo_layer::yolo_layer
              (this_01,iVar5,(vector<int,_std::allocator<int>_> *)dets,anchors,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd30);
    std::allocator<float>::~allocator((allocator<float> *)0x107d4b);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
    std::allocator<int>::~allocator((allocator<int> *)0x107d65);
    apply_yolo(in_stack_fffffffffffffd30);
    get_yolo_detections(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
                        in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe14);
    do_nms_sort(dets,(int)((ulong)anchors >> 0x20),SUB84(anchors,0));
    draw_detections(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,thresh_00,labels_00,
                    (vector<yolo_image,_std::allocator<yolo_image>_> *)CONCAT44(uVar7,uVar6));
    yolo_layer::~yolo_layer(this_00);
    yolo_layer::~yolo_layer(this_00);
  }
  else {
    fprintf(_stderr,"%s: ggml_backend_graph_compute() failed\n","detect");
  }
  local_8c = (uint)!bVar4;
  yolo_image::~yolo_image((yolo_image *)0x107e30);
  std::vector<detection,_std::allocator<detection>_>::~vector
            ((vector<detection,_std::allocator<detection>_> *)in_stack_fffffffffffffd30);
  return;
}

Assistant:

void detect(yolo_image & img, struct ggml_cgraph * gf, const yolo_model & model, float thresh, const std::vector<std::string> & labels, const std::vector<yolo_image> & alphabet)
{
    std::vector<detection> detections;
    yolo_image sized = letterbox_image(img, model.width, model.height);
    struct ggml_tensor * input = ggml_graph_get_tensor(gf, "input");
    ggml_backend_tensor_set(input, sized.data.data(), 0, ggml_nbytes(input));

    if (ggml_backend_graph_compute(model.backend, gf) != GGML_STATUS_SUCCESS) {
        fprintf(stderr, "%s: ggml_backend_graph_compute() failed\n", __func__);
        return;
    }

    struct ggml_tensor * layer_15 = ggml_graph_get_tensor(gf, "layer_15");
    yolo_layer yolo16{ 80, {3, 4, 5}, {10, 14, 23, 27, 37,58, 81, 82, 135, 169, 344, 319}, layer_15};
    apply_yolo(yolo16);
    get_yolo_detections(yolo16, detections, img.w, img.h, model.width, model.height, thresh);

    struct ggml_tensor * layer_22 = ggml_graph_get_tensor(gf, "layer_22");
    yolo_layer yolo23{ 80, {0, 1, 2}, {10, 14, 23, 27, 37,58, 81, 82, 135, 169, 344, 319}, layer_22};
    apply_yolo(yolo23);
    get_yolo_detections(yolo23, detections, img.w, img.h, model.width, model.height, thresh);

    do_nms_sort(detections, yolo23.classes, .45);
    draw_detections(img, detections, thresh, labels, alphabet);
}